

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O2

void av1_filter_block_plane_horz_opt_chroma
               (AV1_COMMON *cm,MACROBLOCKD *xd,MACROBLOCKD_PLANE *plane_ptr,uint32_t mi_row,
               uint32_t mi_col,AV1_DEBLOCKING_PARAMETERS *params_buf,TX_SIZE *tx_buf,int plane,
               _Bool joint_filter_chroma,int num_mis_in_lpf_unit_height_log2)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  loop_filter_info_n *lfi_n;
  BLOCK_SIZE BVar3;
  uint subsampling_x;
  uint subsampling_y;
  aom_bit_depth_t bd;
  MB_MODE_INFO *pMVar4;
  MB_MODE_INFO **ppMVar5;
  loop_filter_thresh *_blimit0;
  bool bVar6;
  uint16_t *s;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  byte bVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  uchar *s_00;
  int iVar18;
  uint32_t uVar19;
  int iVar20;
  uint16_t *s_01;
  byte bVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  uint8_t *dst_ptr;
  AV1_DEBLOCKING_PARAMETERS *pAVar27;
  uint8_t *puVar28;
  uint uVar29;
  byte *pbVar30;
  MB_MODE_INFO *pMVar31;
  byte *local_b8;
  ulong uVar26;
  
  subsampling_x = plane_ptr->subsampling_x;
  subsampling_y = plane_ptr->subsampling_y;
  bVar14 = (byte)subsampling_x;
  bVar15 = (byte)subsampling_y;
  iVar24 = (((1 << (bVar15 & 0x1f)) >> 1) + (((plane_ptr->dst).height << (bVar15 & 0x1f)) + 3 >> 2)
           >> (bVar15 & 0x1f)) - (mi_row >> (bVar15 & 0x1f));
  iVar18 = (1 << ((byte)num_mis_in_lpf_unit_height_log2 & 0x1f)) >> (bVar15 & 0x1f);
  if (iVar24 < iVar18) {
    iVar18 = iVar24;
  }
  uVar10 = (((1 << (bVar14 & 0x1f)) >> 1) + (((plane_ptr->dst).width << (bVar14 & 0x1f)) + 3 >> 2)
           >> (bVar14 & 0x1f)) - (mi_col >> (bVar14 & 0x1f));
  uVar22 = 0x20 >> (bVar14 & 0x1f);
  if ((int)uVar10 < (int)uVar22) {
    uVar22 = uVar10;
  }
  lVar13 = (long)((cm->mi_params).mi_stride << (bVar15 & 0x1f));
  uVar10 = subsampling_y | mi_row;
  iVar24 = (plane_ptr->dst).stride;
  lfi_n = &cm->lf_info;
  uVar23 = 0;
  do {
    if ((int)uVar22 <= (int)uVar23) {
      return;
    }
    params_buf->filter_length = '\0';
    uVar25 = (uVar23 << (bVar14 & 0x1f)) + mi_col | subsampling_x;
    uVar26 = (ulong)uVar25;
    ppMVar5 = (cm->mi_params).mi_grid_base + (cm->mi_params).mi_stride * uVar10 + uVar26;
    pMVar4 = *ppMVar5;
    if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0)) {
      if (plane == 0) {
        bVar8 = pMVar4->tx_size;
        if ((((pMVar4->field_0xa7 & 0x80) != 0) || ('\0' < pMVar4->ref_frame[0])) &&
           (pMVar4->skip_txfm == '\0')) {
          BVar3 = pMVar4->bsize;
          bVar8 = pMVar4->inter_tx_size
                  [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [BVar3] - 1 & uVar25) >>
                   (av1_get_txb_size_index_tw_w_log2_table[BVar3] & 0x1f)) +
                   (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [BVar3] - 1 & uVar10) >>
                    (av1_get_txb_size_index_tw_h_log2_table[BVar3] & 0x1f)) <<
                   (av1_get_txb_size_index_stride_log2_table[BVar3] & 0x1f))];
        }
      }
      else {
        bVar8 = av1_get_max_uv_txsize(pMVar4->bsize,subsampling_x,subsampling_y);
      }
      *tx_buf = bVar8;
      if (mi_row != 0) {
        pMVar31 = ppMVar5[-lVar13];
        if (xd != (MACROBLOCKD *)0x0) goto LAB_0032d54b;
LAB_0032d56c:
        if (plane == 0) {
          bVar9 = pMVar31->tx_size;
          if ((((pMVar31->field_0xa7 & 0x80) != 0) || ('\0' < pMVar31->ref_frame[0])) &&
             (pMVar31->skip_txfm == '\0')) {
            BVar3 = pMVar31->bsize;
            bVar9 = pMVar31->inter_tx_size
                    [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [BVar3] - 1 & uVar25) >>
                     (av1_get_txb_size_index_tw_w_log2_table[BVar3] & 0x1f)) +
                     (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [BVar3] - 1 & (-1 << (bVar15 & 0x1f)) + uVar10) >>
                      (av1_get_txb_size_index_tw_h_log2_table[BVar3] & 0x1f)) <<
                     (av1_get_txb_size_index_stride_log2_table[BVar3] & 0x1f))];
          }
        }
        else {
          bVar9 = av1_get_max_uv_txsize(pMVar31->bsize,subsampling_x,subsampling_y);
        }
        goto LAB_0032d61b;
      }
LAB_0032d597:
      iVar20 = 0x40;
      bVar21 = bVar8;
    }
    else {
      *tx_buf = '\0';
      if (mi_row == 0) {
        bVar8 = 0;
        goto LAB_0032d597;
      }
      pMVar31 = ppMVar5[-lVar13];
      bVar8 = 0;
LAB_0032d54b:
      if (xd->lossless[*(ushort *)&pMVar31->field_0xa7 & 7] == 0) goto LAB_0032d56c;
      bVar9 = 0;
LAB_0032d61b:
      iVar20 = tx_size_wide[bVar9];
      bVar7 = get_filter_level(cm,lfi_n,1,plane,pMVar4);
      if (bVar7 == 0) {
        bVar7 = get_filter_level(cm,lfi_n,1,plane,pMVar31);
      }
      bVar6 = true;
      if ((pMVar31 == pMVar4) && (pMVar4->skip_txfm != '\0')) {
        if ((pMVar4->field_0xa7 & 0x80) == 0) {
          bVar6 = pMVar4->ref_frame[0] < '\x01';
        }
        else {
          bVar6 = false;
        }
      }
      bVar21 = bVar8;
      if ((!(bool)(pMVar31 == pMVar4 & (bVar6 ^ 1U))) && (bVar7 != 0)) {
        params_buf->filter_length = (uint8_t)horz_filter_length_chroma[bVar8][bVar9];
        params_buf->lfthr = lfi_n->lfthr + bVar7;
        bVar21 = *tx_buf;
      }
    }
    iVar11 = tx_size_wide[bVar8];
    if (iVar20 < tx_size_wide[bVar8]) {
      iVar11 = iVar20;
    }
    uVar16 = (ulong)bVar21;
    local_b8 = tx_buf;
    pAVar27 = params_buf;
    uVar19 = mi_row;
    while( true ) {
      iVar20 = tx_size_high_unit[uVar16];
      uVar19 = (iVar20 << (bVar15 & 0x1f)) + uVar19;
      if ((iVar18 << (bVar15 & 0x1f)) + mi_row <= uVar19) break;
      pAVar27 = pAVar27 + iVar20;
      pAVar27->filter_length = '\0';
      uVar29 = (cm->mi_params).mi_stride * (uVar19 | subsampling_y);
      ppMVar5 = (cm->mi_params).mi_grid_base;
      pMVar4 = ppMVar5[uVar29 + uVar26];
      if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0)) {
        if (plane == 0) {
          bVar8 = pMVar4->tx_size;
          if ((((pMVar4->field_0xa7 & 0x80) != 0) || ('\0' < pMVar4->ref_frame[0])) &&
             (pMVar4->skip_txfm == '\0')) {
            BVar3 = pMVar4->bsize;
            bVar8 = pMVar4->inter_tx_size
                    [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [BVar3] - 1 & uVar25) >>
                     (av1_get_txb_size_index_tw_w_log2_table[BVar3] & 0x1f)) +
                     (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [BVar3] - 1 & (uVar19 | subsampling_y)) >>
                      (av1_get_txb_size_index_tw_h_log2_table[BVar3] & 0x1f)) <<
                     (av1_get_txb_size_index_stride_log2_table[BVar3] & 0x1f))];
          }
        }
        else {
          bVar8 = av1_get_max_uv_txsize(pMVar4->bsize,subsampling_x,subsampling_y);
        }
      }
      else {
        bVar8 = 0;
      }
      local_b8 = local_b8 + iVar20;
      *local_b8 = bVar8;
      pMVar31 = ppMVar5[(ulong)uVar29 + (uVar26 - lVar13)];
      bVar9 = get_filter_level(cm,lfi_n,1,plane,pMVar4);
      if (bVar9 == 0) {
        bVar9 = get_filter_level(cm,lfi_n,1,plane,pMVar31);
      }
      bVar6 = true;
      if ((pMVar31 == pMVar4) && (pMVar4->skip_txfm != '\0')) {
        if ((pMVar4->field_0xa7 & 0x80) == 0) {
          bVar6 = pMVar4->ref_frame[0] < '\x01';
        }
        else {
          bVar6 = false;
        }
      }
      uVar17 = (ulong)bVar8;
      uVar16 = uVar17;
      if ((bool)(bVar9 != 0 & (pMVar31 != pMVar4 | bVar6))) {
        pAVar27->filter_length = (uint8_t)horz_filter_length_chroma[uVar17][bVar21];
        pAVar27->lfthr = lfi_n->lfthr + bVar9;
        uVar16 = (ulong)*local_b8;
        bVar8 = *local_b8;
      }
      bVar21 = bVar8;
      if (tx_size_wide[uVar17] <= iVar11) {
        iVar11 = tx_size_wide[uVar17];
      }
    }
    if (((uVar23 & 3) == 0) && ((int)(uVar23 | 3) < (int)uVar22)) {
      uVar29 = 2;
      uVar25 = 3;
      if (iVar11 < 0x10) goto LAB_0032d916;
    }
    else {
LAB_0032d916:
      uVar25 = 0;
      uVar29 = 0;
      if ((uVar23 & 1) == 0) {
        uVar25 = (uint)(7 < iVar11 && (int)(uVar23 | 1) < (int)uVar22);
        uVar29 = uVar25;
      }
    }
    pAVar27 = params_buf;
    pbVar30 = tx_buf;
    for (iVar20 = 0; iVar20 < iVar18; iVar20 = iVar20 + iVar11) {
      if (*pbVar30 == 0xff) {
        pAVar27->filter_length = '\0';
        *pbVar30 = 0;
      }
      iVar11 = iVar24 * 4 * iVar20 + uVar23 * 4;
      puVar28 = (plane_ptr->dst).buf + iVar11;
      local_b8._0_1_ = (USE_FILTER_TYPE)uVar29;
      if (joint_filter_chroma) {
        _blimit0 = pAVar27->lfthr;
        s_00 = plane_ptr[1].dst.buf + iVar11;
        if (cm->seq_params->use_highbitdepth == '\0') {
          uVar12 = pAVar27->filter_length - 4;
          uVar12 = uVar12 >> 1 | (uint)((uVar12 & 1) != 0) << 0x1f;
          if ((USE_FILTER_TYPE)local_b8 == '\x01') {
            if (uVar12 == 1) {
              puVar1 = _blimit0->lim;
              puVar2 = _blimit0->hev_thr;
              aom_lpf_horizontal_6_dual_sse2
                        (puVar28,iVar24,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,puVar2)
              ;
              aom_lpf_horizontal_6_dual_sse2
                        (s_00,iVar24,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,puVar2);
            }
            else if (uVar12 == 0) {
              puVar1 = _blimit0->lim;
              puVar2 = _blimit0->hev_thr;
              aom_lpf_horizontal_4_dual_sse2
                        (puVar28,iVar24,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,puVar2)
              ;
              aom_lpf_horizontal_4_dual_sse2
                        (s_00,iVar24,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,puVar2);
            }
          }
          else if (uVar29 == 2) {
            if (uVar12 == 1) {
              (*aom_lpf_horizontal_6_quad)
                        (puVar28,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
              (*aom_lpf_horizontal_6_quad)
                        (s_00,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
            }
            else if (uVar12 == 0) {
              aom_lpf_horizontal_4_quad_sse2
                        (puVar28,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
              aom_lpf_horizontal_4_quad_sse2
                        (s_00,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
            }
          }
          else if (uVar12 == 1) {
            aom_lpf_horizontal_6_sse2
                      (puVar28,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
            aom_lpf_horizontal_6_sse2(s_00,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
          }
          else if (uVar12 == 0) {
            aom_lpf_horizontal_4_sse2
                      (puVar28,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
            aom_lpf_horizontal_4_sse2(s_00,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
          }
        }
        else {
          bd = cm->seq_params->bit_depth;
          s = (uint16_t *)((long)puVar28 * 2);
          s_01 = (uint16_t *)((long)s_00 * 2);
          uVar12 = pAVar27->filter_length - 4;
          uVar12 = uVar12 >> 1 | (uint)((uVar12 & 1) != 0) << 0x1f;
          if ((USE_FILTER_TYPE)local_b8 == '\x01') {
            if (uVar12 == 1) {
              aom_highbd_lpf_horizontal_6_dual_sse2
                        (s,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,_blimit0->mblim,
                         _blimit0->lim,_blimit0->hev_thr,bd);
LAB_0032de31:
              aom_highbd_lpf_horizontal_6_dual_sse2
                        (s_01,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,_blimit0->mblim
                         ,_blimit0->lim,_blimit0->hev_thr,bd);
            }
            else if (uVar12 == 0) {
              (*aom_highbd_lpf_horizontal_4_dual)
                        (s,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,_blimit0->mblim,
                         _blimit0->lim,_blimit0->hev_thr,bd);
LAB_0032dbf5:
              (*aom_highbd_lpf_horizontal_4_dual)
                        (s_01,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,_blimit0->mblim
                         ,_blimit0->lim,_blimit0->hev_thr,bd);
            }
          }
          else if (uVar29 == 2) {
            if (uVar12 == 1) {
              puVar28 = _blimit0->lim;
              puVar1 = _blimit0->hev_thr;
              aom_highbd_lpf_horizontal_6_dual_sse2
                        (s,iVar24,_blimit0->mblim,puVar28,puVar1,_blimit0->mblim,puVar28,puVar1,bd);
              aom_highbd_lpf_horizontal_6_dual_sse2
                        (s + 8,iVar24,_blimit0->mblim,puVar28,puVar1,_blimit0->mblim,puVar28,puVar1,
                         bd);
              aom_highbd_lpf_horizontal_6_dual_sse2
                        (s_01,iVar24,_blimit0->mblim,puVar28,puVar1,_blimit0->mblim,puVar28,puVar1,
                         bd);
              s_01 = s_01 + 8;
              goto LAB_0032de31;
            }
            if (uVar12 == 0) {
              puVar28 = _blimit0->lim;
              puVar1 = _blimit0->hev_thr;
              (*aom_highbd_lpf_horizontal_4_dual)
                        (s,iVar24,_blimit0->mblim,puVar28,puVar1,_blimit0->mblim,puVar28,puVar1,bd);
              (*aom_highbd_lpf_horizontal_4_dual)
                        (s + 8,iVar24,_blimit0->mblim,puVar28,puVar1,_blimit0->mblim,puVar28,puVar1,
                         bd);
              (*aom_highbd_lpf_horizontal_4_dual)
                        (s_01,iVar24,_blimit0->mblim,puVar28,puVar1,_blimit0->mblim,puVar28,puVar1,
                         bd);
              s_01 = s_01 + 8;
              goto LAB_0032dbf5;
            }
          }
          else if (uVar12 == 1) {
            aom_highbd_lpf_horizontal_6_sse2
                      (s,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
            aom_highbd_lpf_horizontal_6_sse2
                      (s_01,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
          }
          else if (uVar12 == 0) {
            aom_highbd_lpf_horizontal_4_sse2
                      (s,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
            aom_highbd_lpf_horizontal_4_sse2
                      (s_01,iVar24,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
          }
        }
      }
      else {
        filter_horz(puVar28,iVar24,pAVar27,cm->seq_params,(USE_FILTER_TYPE)local_b8);
      }
      iVar11 = tx_size_high_unit[*pbVar30];
      pbVar30 = pbVar30 + iVar11;
      pAVar27 = pAVar27 + iVar11;
    }
    uVar23 = uVar23 + uVar25 + 1;
  } while( true );
}

Assistant:

void av1_filter_block_plane_horz_opt_chroma(
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const MACROBLOCKD_PLANE *const plane_ptr, const uint32_t mi_row,
    const uint32_t mi_col, AV1_DEBLOCKING_PARAMETERS *params_buf,
    TX_SIZE *tx_buf, int plane, bool joint_filter_chroma,
    int num_mis_in_lpf_unit_height_log2) {
  const uint32_t scale_horz = plane_ptr->subsampling_x;
  const uint32_t scale_vert = plane_ptr->subsampling_y;
  const int dst_stride = plane_ptr->dst.stride;
  // Ensure that mi_cols/mi_rows are calculated based on frame dimension aligned
  // to MI_SIZE.
  const int mi_cols =
      ((plane_ptr->dst.width << scale_horz) + MI_SIZE - 1) >> MI_SIZE_LOG2;
  const int mi_rows =
      ((plane_ptr->dst.height << scale_vert) + MI_SIZE - 1) >> MI_SIZE_LOG2;
  const int plane_mi_rows = ROUND_POWER_OF_TWO(mi_rows, scale_vert);
  const int plane_mi_cols = ROUND_POWER_OF_TWO(mi_cols, scale_horz);
  const int y_range =
      AOMMIN((int)(plane_mi_rows - (mi_row >> scale_vert)),
             ((1 << num_mis_in_lpf_unit_height_log2) >> scale_vert));
  const int x_range = AOMMIN((int)(plane_mi_cols - (mi_col >> scale_horz)),
                             (MAX_MIB_SIZE >> scale_horz));
  const ptrdiff_t mode_step = cm->mi_params.mi_stride << scale_vert;
  for (int x = 0; x < x_range; x++) {
    const uint32_t y_start = mi_row + (0 << scale_vert);
    const uint32_t curr_x = mi_col + (x << scale_horz);
    const uint32_t y_end = mi_row + (y_range << scale_vert);
    int min_width = tx_size_wide[TX_64X64];
    set_lpf_parameters_for_line_chroma(params_buf, tx_buf, cm, xd, HORZ_EDGE,
                                       curr_x, y_start, plane_ptr, y_end,
                                       mode_step, scale_horz, scale_vert,
                                       &min_width, plane, joint_filter_chroma);

    AV1_DEBLOCKING_PARAMETERS *params = params_buf;
    TX_SIZE *tx_size = tx_buf;
    USE_FILTER_TYPE use_filter_type = USE_SINGLE;
    int x_inc = 0;

    if ((x & 3) == 0 && (x + 3) < x_range && min_width >= 16) {
      // If we are on a col which is a multiple of 4, and the minimum width is
      // 16 pixels, then the current and right 3 cols must contain the same tx
      // block. This is because dim 16 can only happen every unit of 4 mi's.
      use_filter_type = USE_QUAD;
      x_inc = 3;
    } else if (x % 2 == 0 && (x + 1) < x_range && min_width >= 8) {
      // If we are on an even col, and the minimum width is 8 pixels, then the
      // current and left cols must contain the same tx block. This is because
      // dim 4 can only happen every unit of 2**0, and 8 every unit of 2**1,
      // etc.
      use_filter_type = USE_DUAL;
      x_inc = 1;
    }

    for (int y = 0; y < y_range;) {
      // inner loop always filter vertical edges in a MI block. If MI size
      // is 8x8, it will first filter the vertical edge aligned with a 8x8
      // block. If 4x4 transform is used, it will then filter the internal
      // edge aligned with a 4x4 block
      if (*tx_size == TX_INVALID) {
        params->filter_length = 0;
        *tx_size = TX_4X4;
      }

      const int offset = y * MI_SIZE * dst_stride + x * MI_SIZE;
      if (joint_filter_chroma) {
        uint8_t *u_dst = plane_ptr[0].dst.buf + offset;
        uint8_t *v_dst = plane_ptr[1].dst.buf + offset;
        filter_horz_chroma(u_dst, v_dst, dst_stride, params, cm->seq_params,
                           use_filter_type);
      } else {
        uint8_t *dst_ptr = plane_ptr->dst.buf + offset;
        filter_horz(dst_ptr, dst_stride, params, cm->seq_params,
                    use_filter_type);
      }

      // advance the destination pointer
      const int advance_units = tx_size_high_unit[*tx_size];
      y += advance_units;
      params += advance_units;
      tx_size += advance_units;
    }
    x += x_inc;
  }
}